

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

void display_monster(wchar_t col,wchar_t row,_Bool cursor,wchar_t oid)

{
  uint8_t attr;
  wchar_t wVar1;
  monster_race *pmVar2;
  monster_lore *pmVar3;
  _Bool _Var4;
  undefined7 in_register_00000011;
  char *pcVar5;
  wchar_t c;
  uint8_t uVar6;
  uint8_t a;
  
  pmVar3 = l_list;
  pmVar2 = r_info;
  wVar1 = default_join[oid].oid;
  attr = curs_attrs[1][CONCAT71(in_register_00000011,cursor) & 0xffffffff];
  a = monster_x_attr[r_info[wVar1].ridx];
  if ((tile_height == '\x01') || (-1 < (char)a)) {
    c = monster_x_char[r_info[wVar1].ridx];
    if (((player->opts).opt[0x10] == true) && (uVar6 = a, -1 < (char)a)) goto LAB_001d933e;
  }
  else {
    a = r_info[wVar1].d_attr;
    c = r_info[wVar1].d_char;
    uVar6 = a;
    if ((player->opts).opt[0x10] != false) {
LAB_001d933e:
      _Var4 = flag_has_dbg(r_info[wVar1].flags,0xb,1,"race->flags","RF_UNIQUE");
      a = '\x11';
      if (!_Var4) {
        a = uVar6;
      }
    }
  }
  c_prt(attr,pmVar2[wVar1].name,row,col);
  big_pad(L'B',row,a,c);
  if (pmVar2[wVar1].rarity == L'\0') {
    pcVar5 = "shape";
  }
  else {
    _Var4 = flag_has_dbg(pmVar2[wVar1].flags,0xb,1,"race->flags","RF_UNIQUE");
    if (!_Var4) {
      pcVar5 = format("%5d",(ulong)pmVar3[wVar1].pkills);
      goto LAB_001d941f;
    }
    pcVar5 = "alive";
    if (pmVar2[wVar1].max_num == '\0') {
      pcVar5 = " dead";
    }
  }
  pcVar5 = format("%s",pcVar5);
LAB_001d941f:
  put_str(pcVar5,row,L'F');
  return;
}

Assistant:

static void display_monster(int col, int row, bool cursor, int oid)
{
	/* HACK Get the race index. (Should be a wrapper function) */
	int r_idx = default_item_id(oid);

	/* Access the race */
	struct monster_race *race = &r_info[r_idx];
	struct monster_lore *lore = &l_list[r_idx];

	/* Choose colors */
	uint8_t attr = curs_attrs[CURS_KNOWN][(int)cursor];
	uint8_t a = monster_x_attr[race->ridx];
	wchar_t c = monster_x_char[race->ridx];

	if ((tile_height != 1) && (a & 0x80)) {
		a = race->d_attr;
		c = race->d_char;
		/* If uniques are purple, make it so */
		if (OPT(player, purple_uniques) && rf_has(race->flags, RF_UNIQUE))
			a = COLOUR_VIOLET;
	}
	/* If uniques are purple, make it so */
	else if (OPT(player, purple_uniques) && !(a & 0x80) &&
			 rf_has(race->flags, RF_UNIQUE))
		a = COLOUR_VIOLET;

	/* Display the name */
	c_prt(attr, race->name, row, col);

	/* Display symbol */
	big_pad(66, row, a, c);

	/* Display kills */
	if (!race->rarity) {
		put_str(format("%s", "shape"), row, 70);
	} else if (rf_has(race->flags, RF_UNIQUE)) {
		put_str(format("%s", (race->max_num == 0)?  " dead" : "alive"),
				row, 70);
	} else {
		put_str(format("%5d", lore->pkills), row, 70);
	}
}